

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::ParseOneof<proto2_unittest::TestAllTypes>::
TestBody(ParseOneof<proto2_unittest::TestAllTypes> *this)

{
  void *data_00;
  int size;
  undefined1 local_130 [8];
  CodedInputStream input;
  ArrayInputStream raw_input;
  string data;
  undefined1 local_90 [8];
  TestOneof2 dest;
  TestOneof2 source;
  ParseOneof<proto2_unittest::TestAllTypes> *this_local;
  
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)((long)&dest.field_0 + 0x28));
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)local_90);
  std::__cxx11::string::string((string *)&raw_input.position_);
  TestUtil::SetOneof1<proto2_unittest::TestOneof2>((TestOneof2 *)((long)&dest.field_0 + 0x28));
  protobuf::MessageLite::SerializeToString
            ((MessageLite *)((long)&dest.field_0 + 0x28),(string *)&raw_input.position_);
  data_00 = (void *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  protobuf::io::ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)&input.extension_factory_,data_00,size,-1);
  protobuf::io::CodedInputStream::CodedInputStream
            ((CodedInputStream *)local_130,(ZeroCopyInputStream *)&input.extension_factory_);
  WireFormat::ParseAndMergePartial((CodedInputStream *)local_130,(Message *)local_90);
  TestUtil::ExpectOneofSet1<proto2_unittest::TestOneof2>((TestOneof2 *)local_90);
  protobuf::io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_130);
  protobuf::io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&input.extension_factory_);
  std::__cxx11::string::~string((string *)&raw_input.position_);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)local_90);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)((long)&dest.field_0 + 0x28));
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, ParseOneof) {
  typename TestFixture::TestOneof2 source, dest;
  std::string data;

  // Serialize using the generated code.
  TestUtil::SetOneof1(&source);
  source.SerializeToString(&data);

  // Parse using WireFormat.
  io::ArrayInputStream raw_input(data.data(), data.size());
  io::CodedInputStream input(&raw_input);
  WireFormat::ParseAndMergePartial(&input, &dest);

  // Check.
  TestUtil::ExpectOneofSet1(dest);
}